

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

float __thiscall Imath_3_2::Vec4<float>::lengthTiny(Vec4<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar1 = this->x;
  uVar2 = this->y;
  uVar3 = -(uint)((float)uVar1 < -(float)uVar1);
  uVar4 = -(uint)((float)uVar2 < -(float)uVar2);
  fVar6 = (float)(~uVar3 & uVar1 | (uint)-(float)uVar1 & uVar3);
  fVar7 = (float)(~uVar4 & uVar2 | (uint)-(float)uVar2 & uVar4);
  fVar10 = this->z;
  uVar3 = -(uint)(fVar10 < -fVar10);
  fVar8 = (float)(~uVar3 & (uint)fVar10 | (uint)-fVar10 & uVar3);
  fVar10 = this->w;
  uVar3 = -(uint)(fVar10 < -fVar10);
  fVar9 = (float)(~uVar3 & (uint)fVar10 | (uint)-fVar10 & uVar3);
  fVar10 = fVar7;
  if (fVar7 <= fVar6) {
    fVar10 = fVar6;
  }
  fVar5 = fVar8;
  if (fVar8 <= fVar10) {
    fVar5 = fVar10;
  }
  fVar10 = fVar9;
  if (fVar9 <= fVar5) {
    fVar10 = fVar5;
  }
  fVar5 = 0.0;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    fVar5 = SQRT((fVar9 / fVar10) * (fVar9 / fVar10) +
                 (fVar8 / fVar10) * (fVar8 / fVar10) +
                 (fVar6 / fVar10) * (fVar6 / fVar10) + (fVar7 / fVar10) * (fVar7 / fVar10)) * fVar10
    ;
  }
  return fVar5;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec4<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;
    T absW = (w >= T (0)) ? w : -w;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (max < absW) max = absW;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;
    absW /= max;

    return max *
           std::sqrt (absX * absX + absY * absY + absZ * absZ + absW * absW);
}